

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O3

bool __thiscall
vkt::tessellation::anon_unknown_0::PrimitiveSetInvariance::InvariantTriangleSetTestInstance::compare
          (InvariantTriangleSetTestInstance *this,PerPrimitiveVec *primitivesA,
          PerPrimitiveVec *primitivesB,int param_3)

{
  _Rb_tree_header *p_Var1;
  undefined4 *puVar2;
  ostringstream *poVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  pointer pPVar6;
  pointer pPVar7;
  TestLog *pTVar8;
  pointer pPVar9;
  pointer pPVar10;
  pointer pPVar11;
  bool bVar12;
  PerPrimitiveVec *pPVar13;
  _Base_ptr p_Var14;
  _Base_ptr p_Var15;
  PerPrimitiveVec *pPVar16;
  _Rb_tree_header *p_Var17;
  Vector<tcu::Vector<float,_3>,_3> *b;
  long lVar18;
  _Link_type __x;
  set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  *this_00;
  uint uVar19;
  ulong uVar20;
  bool bVar21;
  bool bVar22;
  pair<std::_Rb_tree_const_iterator<tcu::Vector<tcu::Vector<float,_3>,_3>_>,_bool> pVar23;
  TriangleSet trianglesB;
  TriangleSet trianglesA;
  char local_228 [16];
  set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  local_218;
  set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  local_1e8;
  undefined1 local_1b8 [392];
  
  pPVar6 = (primitivesA->
           super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pPVar7 = (primitivesA->
           super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pTVar8 = ((this->super_InvarianceTestInstance).super_TestInstance.m_context)->m_testCtx->m_log;
  pPVar9 = (primitivesB->
           super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pPVar10 = (primitivesB->
            super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1e8._M_t._M_impl.super__Rb_tree_header._M_header;
  local_1e8._M_t._M_impl._0_1_ = 0;
  local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1e8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_218._M_t._M_impl.super__Rb_tree_header._M_header;
  local_218._M_t._M_impl._0_1_ = 0;
  local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_218._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pPVar16 = primitivesB;
  __x = (_Link_type)primitivesA;
  local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar12 = true;
  do {
    bVar22 = bVar12;
    uVar20 = (long)pPVar9 - (long)pPVar10;
    if (bVar22) {
      uVar20 = (long)pPVar6 - (long)pPVar7;
    }
    this_00 = &local_218;
    if (bVar22) {
      this_00 = &local_1e8;
    }
    uVar19 = (uint)(uVar20 >> 6);
    if (0 < (int)uVar19) {
      uVar20 = (ulong)(uVar19 & 0x7fffffff);
      lVar18 = 0x38;
      do {
        pPVar13 = primitivesB;
        if (bVar22) {
          pPVar13 = primitivesA;
        }
        pPVar11 = (pPVar13->
                  super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        uVar4 = *(undefined8 *)((long)pPVar11->unused_padding + lVar18 + -0x2c);
        local_1b8._8_4_ = (undefined4)((ulong)uVar4 >> 0x20);
        local_1b8._32_4_ = *(undefined4 *)((long)pPVar11->unused_padding + lVar18 + -8);
        local_1b8._12_4_ = *(undefined4 *)((long)pPVar11->unused_padding + lVar18 + -0x20);
        puVar2 = (undefined4 *)((long)pPVar11->unused_padding + lVar18 + -0x1c);
        local_1b8._16_4_ = *puVar2;
        local_1b8._20_4_ = puVar2[1];
        uVar5 = *(undefined8 *)((long)pPVar11->unused_padding + lVar18 + -0x10);
        local_1b8._24_4_ = (undefined4)uVar5;
        local_1b8._28_4_ = (undefined4)((ulong)uVar5 >> 0x20);
        local_1b8._4_4_ = (int)uVar4;
        local_1b8._0_4_ = *(undefined4 *)((long)pPVar11->unused_padding + lVar18 + -0x30);
        std::
        __insertion_sort<tcu::Vector<float,3>*,__gnu_cxx::__ops::_Iter_comp_iter<vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>>>
                  ((_Link_type)local_1b8,local_1b8 + 0x24,pPVar16);
        __x = (_Link_type)local_1b8;
        pVar23 = std::
                 set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
                 ::insert(this_00,(value_type *)local_1b8);
        pPVar16 = pVar23._8_8_;
        lVar18 = lVar18 + 0x40;
        uVar20 = uVar20 - 1;
      } while (uVar20 != 0);
    }
    bVar12 = false;
  } while (bVar22);
  p_Var1 = &local_1e8._M_t._M_impl.super__Rb_tree_header;
  bVar12 = true;
  p_Var14 = local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var15 = local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_218._M_t._M_impl.super__Rb_tree_header ||
      (_Rb_tree_header *)local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
    do {
      p_Var17 = &local_218._M_t._M_impl.super__Rb_tree_header;
      bVar21 = (_Rb_tree_header *)p_Var15 == p_Var17;
      bVar22 = (_Rb_tree_header *)p_Var14 == p_Var1;
      if ((bVar22) || ((_Rb_tree_header *)p_Var15 == p_Var17)) {
LAB_0079d7c3:
        poVar3 = (ostringstream *)(local_1b8 + 8);
        local_1b8._0_8_ = pTVar8;
        std::__cxx11::ostringstream::ostringstream(poVar3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,
                   "Failure: triangle sets in two cases are not equal (when ignoring triangle and vertex order"
                   ,0x5a);
        local_228[0] = '\0';
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,local_228,0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,")",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar3);
        std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x78));
        if ((bVar22) ||
           ((!bVar21 &&
            (bVar12 = LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>
                      ::operator()((LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>
                                    *)(p_Var14 + 1),
                                   (Vector<tcu::Vector<float,_3>,_3> *)(p_Var15 + 1),b), !bVar12))))
        {
          poVar3 = (ostringstream *)(local_1b8 + 8);
          local_1b8._0_8_ = pTVar8;
          std::__cxx11::ostringstream::ostringstream(poVar3);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3,"Note: e.g. triangle ",0x14);
          tcu::operator<<((ostream *)poVar3,(Vector<tcu::Vector<float,_3>,_3> *)(p_Var15 + 1));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3," exists for second case but not for first",0x29);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        }
        else {
          poVar3 = (ostringstream *)(local_1b8 + 8);
          local_1b8._0_8_ = pTVar8;
          std::__cxx11::ostringstream::ostringstream(poVar3);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3,"Note: e.g. triangle ",0x14);
          tcu::operator<<((ostream *)poVar3,(Vector<tcu::Vector<float,_3>,_3> *)(p_Var14 + 1));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3," exists for first case but not for second",0x29);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        }
        __x = (_Link_type)&std::__cxx11::ostringstream::VTT;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b8 + 8));
        std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x78));
        bVar12 = false;
        break;
      }
      __x = (_Link_type)(p_Var15 + 1);
      bVar22 = tcu::Vector<tcu::Vector<float,_3>,_3>::operator==
                         ((Vector<tcu::Vector<float,_3>,_3> *)(p_Var14 + 1),
                          (Vector<tcu::Vector<float,_3>,_3> *)__x);
      if (!bVar22) {
        bVar22 = false;
        bVar21 = false;
        goto LAB_0079d7c3;
      }
      p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14);
      p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
    } while (((_Rb_tree_header *)p_Var14 != p_Var1) ||
            ((_Rb_tree_header *)p_Var15 != &local_218._M_t._M_impl.super__Rb_tree_header));
  }
  std::
  _Rb_tree<tcu::Vector<tcu::Vector<float,_3>,_3>,_tcu::Vector<tcu::Vector<float,_3>,_3>,_std::_Identity<tcu::Vector<tcu::Vector<float,_3>,_3>_>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  ::_M_erase((_Rb_tree<tcu::Vector<tcu::Vector<float,_3>,_3>,_tcu::Vector<tcu::Vector<float,_3>,_3>,_std::_Identity<tcu::Vector<tcu::Vector<float,_3>,_3>_>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
              *)local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,__x);
  std::
  _Rb_tree<tcu::Vector<tcu::Vector<float,_3>,_3>,_tcu::Vector<tcu::Vector<float,_3>,_3>,_std::_Identity<tcu::Vector<tcu::Vector<float,_3>,_3>_>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  ::_M_erase((_Rb_tree<tcu::Vector<tcu::Vector<float,_3>,_3>,_tcu::Vector<tcu::Vector<float,_3>,_3>,_std::_Identity<tcu::Vector<tcu::Vector<float,_3>,_3>_>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
              *)local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,__x);
  return bVar12;
}

Assistant:

bool compare (const PerPrimitiveVec& primitivesA, const PerPrimitiveVec& primitivesB, const int) const
	{
		return compareTriangleSets(primitivesA, primitivesB, m_context.getTestContext().getLog());
	}